

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O1

BOOL __thiscall
Memory::PreReservedVirtualAllocWrapper::Free
          (PreReservedVirtualAllocWrapper *this,LPVOID lpAddress,size_t dwSize,DWORD dwFreeType)

{
  LPVOID pvVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint index;
  undefined4 *puVar8;
  undefined8 *in_FS_OFFSET;
  uint local_38;
  
  CCLock::Enter(&(this->cs).super_CCLock);
  if (dwSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)*in_FS_OFFSET;
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0x1b0,"(false)","false");
  }
  else {
    if (this->preReservedStartAddress != (LPVOID)0x0) {
      if ((dwSize & 0xfff) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)*in_FS_OFFSET;
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x1ba,"(dwSize % AutoSystemInfo::PageSize == 0)",
                           "dwSize % AutoSystemInfo::PageSize == 0");
        if (!bVar3) goto LAB_002b0402;
        *puVar8 = 0;
      }
      BVar4 = VirtualFree(lpAddress,dwSize,0x4000);
      uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
      uVar7 = dwSize / uVar5;
      if (uVar7 >> 0x20 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)*in_FS_OFFSET;
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x1bf,"(requestedNumOfSegments <= ((uint32_t)~((uint32_t)0)))",
                           "requestedNumOfSegments <= MAXUINT32");
        if (!bVar3) goto LAB_002b0402;
        *puVar8 = 0;
      }
      if (BVar4 != 0) {
        Output::Trace(PreReservedHeapAllocPhase,L"MEM_DECOMMIT: Address: 0x%p of size: 0x%x bytes\n"
                      ,lpAddress,dwSize);
        if (-1 < (short)dwFreeType) goto LAB_002b03e7;
        if (lpAddress < this->preReservedStartAddress) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)*in_FS_OFFSET;
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x1c8,"((uintptr_t) lpAddress >= (uintptr_t) preReservedStartAddress)"
                             ,"(uintptr_t) lpAddress >= (uintptr_t) preReservedStartAddress");
          if (!bVar3) goto LAB_002b0402;
          *puVar8 = 0;
        }
        uVar6 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
        local_38 = (uint)lpAddress;
        if ((local_38 & uVar6 - 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)*in_FS_OFFSET;
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x1c9,
                             "(((uintptr_t)lpAddress & (AutoSystemInfo::Data.GetAllocationGranularityPageCount() - 1)) == 0)"
                             ,"Not aligned with Allocation Granularity?");
          if (!bVar3) goto LAB_002b0402;
          *puVar8 = 0;
        }
        uVar6 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
        if (dwSize % (ulong)uVar6 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)*in_FS_OFFSET;
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x1ca,
                             "(dwSize % AutoSystemInfo::Data.GetAllocationGranularityPageSize() == 0)"
                             ,"Release size should match the allocation granularity size");
          if (!bVar3) goto LAB_002b0402;
          *puVar8 = 0;
        }
        if (dwSize < uVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)*in_FS_OFFSET;
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x1cb,"(requestedNumOfSegments != 0)","requestedNumOfSegments != 0");
          if (!bVar3) goto LAB_002b0402;
          *puVar8 = 0;
        }
        pvVar1 = this->preReservedStartAddress;
        uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
        index = (uint)((ulong)((long)lpAddress - (long)pvVar1) / (ulong)uVar5);
        if (0xfff < index) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)*in_FS_OFFSET;
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x1ce,"(freeSegmentsBVIndex < PreReservedAllocationSegmentCount)",
                             "Invalid Index ?");
          if (!bVar3) goto LAB_002b0402;
          *puVar8 = 0;
        }
        BVStatic<4096UL>::SetRange(&this->freeSegments,index,(uint)uVar7);
        uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
        Output::Trace(PreReservedHeapAllocPhase,
                      L"MEM_RELEASE: Address: 0x%p of size: 0x%x * 0x%x bytes\n",lpAddress,uVar7,
                      (ulong)uVar5);
      }
      goto LAB_002b03e7;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)*in_FS_OFFSET;
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0x1b6,"(false)","false");
  }
  if (bVar3 == false) {
LAB_002b0402:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar8 = 0;
  BVar4 = 0;
LAB_002b03e7:
  CCLock::Leave(&(this->cs).super_CCLock);
  return BVar4;
}

Assistant:

BOOL
PreReservedVirtualAllocWrapper::Free(LPVOID lpAddress, size_t dwSize, DWORD dwFreeType)
{
    {
        AutoCriticalSection autocs(&this->cs);

        if (dwSize == 0)
        {
            Assert(false);
            return FALSE;
        }

        if (preReservedStartAddress == nullptr)
        {
            Assert(false);
            return FALSE;
        }

        Assert(dwSize % AutoSystemInfo::PageSize == 0);
#pragma warning(suppress: 6250)
#pragma warning(suppress: 28160) // Calling VirtualFreeEx without the MEM_RELEASE flag frees memory but not address descriptors (VADs)
        BOOL success = VirtualFree(lpAddress, dwSize, MEM_DECOMMIT);
        size_t requestedNumOfSegments = dwSize / AutoSystemInfo::Data.GetAllocationGranularityPageSize();
        Assert(requestedNumOfSegments <= MAXUINT32);

        if (success)
        {
            PreReservedHeapTrace(_u("MEM_DECOMMIT: Address: 0x%p of size: 0x%x bytes\n"), lpAddress, dwSize);
        }

        if (success && (dwFreeType & MEM_RELEASE) != 0)
        {
            Assert((uintptr_t) lpAddress >= (uintptr_t) preReservedStartAddress);
            AssertMsg(((uintptr_t)lpAddress & (AutoSystemInfo::Data.GetAllocationGranularityPageCount() - 1)) == 0, "Not aligned with Allocation Granularity?");
            AssertMsg(dwSize % AutoSystemInfo::Data.GetAllocationGranularityPageSize() == 0, "Release size should match the allocation granularity size");
            Assert(requestedNumOfSegments != 0);

            BVIndex freeSegmentsBVIndex = (BVIndex) (((uintptr_t) lpAddress - (uintptr_t) preReservedStartAddress) / AutoSystemInfo::Data.GetAllocationGranularityPageSize());
            AssertMsg(freeSegmentsBVIndex < PreReservedAllocationSegmentCount, "Invalid Index ?");
            freeSegments.SetRange(freeSegmentsBVIndex, static_cast<uint>(requestedNumOfSegments));
            PreReservedHeapTrace(_u("MEM_RELEASE: Address: 0x%p of size: 0x%x * 0x%x bytes\n"), lpAddress, requestedNumOfSegments, AutoSystemInfo::Data.GetAllocationGranularityPageSize());
        }

        return success;
    }
}